

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::SSLTest_ECHThreads_Test::TestBody(SSLTest_ECHThreads_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  EVP_HPKE_KEM *pEVar4;
  SSL_METHOD *method;
  SSL_METHOD *meth;
  thread *thread;
  undefined1 auVar5 [8];
  _Head_base<0UL,_unsigned_char_*,_false> *this_00;
  char *in_R9;
  char *pcVar6;
  pointer *__ptr;
  pointer *__ptr_2;
  AssertionResult gtest_ar__2;
  UniquePtr<SSL_CTX> server_ctx;
  UniquePtr<SSL_CTX> client_ctx;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  UniquePtr<SSL> client;
  UniquePtr<SSL_ECH_KEYS> keys12;
  UniquePtr<SSL_ECH_KEYS> keys1;
  UniquePtr<uint8_t> free_ech_config2;
  uint8_t *ech_config2;
  uint8_t *ech_config1;
  UniquePtr<SSL> server;
  UniquePtr<uint8_t> free_ech_config1;
  size_t ech_config2_len;
  size_t ech_config1_len;
  ScopedEVP_HPKE_KEY key2;
  ScopedEVP_HPKE_KEY key1;
  undefined1 local_1a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a0;
  _Head_base<0UL,_ssl_ctx_st_*,_false> local_198;
  _Head_base<0UL,_ssl_ctx_st_*,_false> local_190;
  undefined1 local_188 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  _Head_base<0UL,_ssl_st_*,_false> local_168;
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_140;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_138;
  _Head_base<0UL,_unsigned_char_*,_false> local_130;
  __uniq_ptr_impl<ssl_st,_bssl::internal::Deleter> local_128;
  _Head_base<0UL,_unsigned_char_*,_false> local_120;
  AssertHelper local_118;
  size_t local_110;
  undefined1 local_108 [16];
  EVP_HPKE_KEM local_f8;
  EVP_HPKE_KEY local_98;
  
  EVP_HPKE_KEY_zero(&local_98);
  pEVar4 = EVP_hpke_x25519_hkdf_sha256();
  iVar3 = EVP_HPKE_KEY_generate(&local_98,pEVar4);
  local_188[0] = iVar3 != 0;
  paStack_180 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
  if (iVar3 == 0) {
    testing::Message::Message((Message *)local_1a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_108,(internal *)local_188,
               (AssertionResult *)"EVP_HPKE_KEY_generate(key1.get(), EVP_hpke_x25519_hkdf_sha256())"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_130,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x9a5,(char *)local_108._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_130,(Message *)local_1a8);
    this_00 = &local_130;
  }
  else {
    pcVar6 = (char *)0x10;
    iVar3 = SSL_marshal_ech_config
                      (&local_130._M_head_impl,&local_110,'\x01',&local_98,"public.example",0x10);
    local_188[0] = iVar3 != 0;
    paStack_180 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
    if (iVar3 != 0) {
      local_120._M_head_impl = local_130._M_head_impl;
      EVP_HPKE_KEY_zero((EVP_HPKE_KEY *)local_108);
      pEVar4 = EVP_hpke_x25519_hkdf_sha256();
      iVar3 = EVP_HPKE_KEY_generate((EVP_HPKE_KEY *)local_108,pEVar4);
      local_1a8[0] = iVar3 != 0;
      local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar3 == 0) {
        testing::Message::Message((Message *)&local_138);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_188,(internal *)local_1a8,
                   (AssertionResult *)
                   "EVP_HPKE_KEY_generate(key2.get(), EVP_hpke_x25519_hkdf_sha256())","false","true"
                   ,pcVar6);
        testing::internal::AssertHelper::AssertHelper
                  (&local_118,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x9ad,(char *)local_188);
        testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_138);
        testing::internal::AssertHelper::~AssertHelper(&local_118);
        if (local_188 != (undefined1  [8])&local_178) {
          operator_delete((void *)local_188,local_178._M_allocated_capacity + 1);
        }
LAB_0016e4e8:
        if (local_138._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_138._M_head_impl + 8))();
        }
        if (local_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1a0,local_1a0);
        }
      }
      else {
        pcVar6 = (char *)0x10;
        iVar3 = SSL_marshal_ech_config
                          ((uint8_t **)&local_138,(size_t *)&local_118,'\x02',
                           (EVP_HPKE_KEY *)local_108,"public.example",0x10);
        local_1a8[0] = iVar3 != 0;
        local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar3 == 0) {
          testing::Message::Message((Message *)&local_140);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_188,(internal *)local_1a8,
                     (AssertionResult *)
                     "SSL_marshal_ech_config(&ech_config2, &ech_config2_len, 2, key2.get(), \"public.example\", 16)"
                     ,"false","true",pcVar6);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_150,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x9b2,(char *)local_188);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)local_150,(Message *)&local_140);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_150);
          local_138._M_head_impl = local_140._M_head_impl;
          if (local_188 != (undefined1  [8])&local_178) {
            operator_delete((void *)local_188,local_178._M_allocated_capacity + 1);
            local_138._M_head_impl = local_140._M_head_impl;
          }
          goto LAB_0016e4e8;
        }
        local_140._M_head_impl = local_138._M_head_impl;
        local_150._0_8_ = SSL_ECH_KEYS_new();
        local_1a8[0] = (SSL_ECH_KEYS *)local_150._0_8_ != (SSL_ECH_KEYS *)0x0;
        local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((SSL_ECH_KEYS *)local_150._0_8_ == (SSL_ECH_KEYS *)0x0) {
          testing::Message::Message((Message *)local_160);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_188,(internal *)local_1a8,(AssertionResult *)"keys1","false",
                     "true",pcVar6);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_198,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x9b7,(char *)local_188);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_198,(Message *)local_160);
LAB_0016e5d0:
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_198);
          if (local_188 != (undefined1  [8])&local_178) {
            operator_delete((void *)local_188,local_178._M_allocated_capacity + 1);
          }
          if ((SSL_ECH_KEYS *)local_160._0_8_ != (SSL_ECH_KEYS *)0x0) {
            (**(code **)(*(long *)local_160._0_8_ + 8))();
          }
          if (local_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_1a0,local_1a0);
          }
        }
        else {
          iVar3 = SSL_ECH_KEYS_add((SSL_ECH_KEYS *)local_150._0_8_,1,local_130._M_head_impl,
                                   local_110,&local_98);
          local_1a8[0] = iVar3 != 0;
          local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar3 == 0) {
            testing::Message::Message((Message *)local_160);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_188,(internal *)local_1a8,
                       (AssertionResult *)
                       "SSL_ECH_KEYS_add(keys1.get(), 1, ech_config1, ech_config1_len, key1.get())",
                       "false","true",pcVar6);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_198,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x9b9,(char *)local_188);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_198,(Message *)local_160);
            goto LAB_0016e5d0;
          }
          local_160._0_8_ = SSL_ECH_KEYS_new();
          local_1a8[0] = (SSL_ECH_KEYS *)local_160._0_8_ != (SSL_ECH_KEYS *)0x0;
          local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if ((SSL_ECH_KEYS *)local_160._0_8_ == (SSL_ECH_KEYS *)0x0) {
            testing::Message::Message((Message *)&local_198);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_188,(internal *)local_1a8,(AssertionResult *)"keys12","false"
                       ,"true",pcVar6);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_190,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x9bb,(char *)local_188);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_190,(Message *)&local_198);
LAB_0016e747:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_190);
            if (local_188 != (undefined1  [8])&local_178) {
              operator_delete((void *)local_188,local_178._M_allocated_capacity + 1);
            }
            if (local_198._M_head_impl != (SSL_CTX *)0x0) {
              (**(code **)(*(long *)local_198._M_head_impl + 8))();
            }
            if (local_1a0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_1a0,local_1a0);
            }
          }
          else {
            iVar3 = SSL_ECH_KEYS_add((SSL_ECH_KEYS *)local_160._0_8_,1,
                                     (uint8_t *)local_138._M_head_impl,(size_t)local_118.data_,
                                     (EVP_HPKE_KEY *)local_108);
            local_1a8[0] = iVar3 != 0;
            local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (iVar3 == 0) {
              testing::Message::Message((Message *)&local_198);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_188,(internal *)local_1a8,
                         (AssertionResult *)
                         "SSL_ECH_KEYS_add(keys12.get(), 1, ech_config2, ech_config2_len, key2.get())"
                         ,"false","true",pcVar6);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_190,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x9bd,(char *)local_188);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_190,(Message *)&local_198);
              goto LAB_0016e747;
            }
            iVar3 = SSL_ECH_KEYS_add((SSL_ECH_KEYS *)local_160._0_8_,0,local_130._M_head_impl,
                                     local_110,&local_98);
            local_1a8[0] = iVar3 != 0;
            local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (iVar3 == 0) {
              testing::Message::Message((Message *)&local_198);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_188,(internal *)local_1a8,
                         (AssertionResult *)
                         "SSL_ECH_KEYS_add(keys12.get(), 0, ech_config1, ech_config1_len, key1.get())"
                         ,"false","true",pcVar6);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_190,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x9bf,(char *)local_188);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_190,(Message *)&local_198);
              goto LAB_0016e747;
            }
            method = TLS_method();
            CreateContextWithTestCertificate((anon_unknown_0 *)&local_198,method);
            local_1a8[0] = local_198._M_head_impl != (SSL_CTX *)0x0;
            local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (local_198._M_head_impl == (SSL_CTX *)0x0) {
              testing::Message::Message((Message *)&local_190);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_188,(internal *)local_1a8,(AssertionResult *)"server_ctx",
                         "false","true",pcVar6);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_168,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x9c3,(char *)local_188);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_168,(Message *)&local_190);
LAB_0016e859:
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
              if (local_188 != (undefined1  [8])&local_178) {
                operator_delete((void *)local_188,local_178._M_allocated_capacity + 1);
              }
              if (local_190._M_head_impl != (SSL_CTX *)0x0) {
                (**(code **)(*(long *)local_190._M_head_impl + 8))();
              }
              if (local_1a0 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_1a0,local_1a0);
              }
            }
            else {
              iVar3 = SSL_CTX_set1_ech_keys(local_198._M_head_impl,(SSL_ECH_KEYS *)local_150._0_8_);
              local_1a8[0] = iVar3 != 0;
              local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (iVar3 == 0) {
                testing::Message::Message((Message *)&local_190);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_188,(internal *)local_1a8,
                           (AssertionResult *)"SSL_CTX_set1_ech_keys(server_ctx.get(), keys1.get())"
                           ,"false","true",pcVar6);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_168,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x9c4,(char *)local_188);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_168,(Message *)&local_190);
                goto LAB_0016e859;
              }
              meth = (SSL_METHOD *)TLS_method();
              local_190._M_head_impl = (ssl_ctx_st *)SSL_CTX_new(meth);
              local_1a8[0] = local_190._M_head_impl != (SSL_CTX *)0x0;
              local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (local_190._M_head_impl == (SSL_CTX *)0x0) {
                testing::Message::Message((Message *)&local_168);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_188,(internal *)local_1a8,(AssertionResult *)"client_ctx"
                           ,"false","true",pcVar6);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_128,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x9c7,(char *)local_188);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_128,(Message *)&local_168);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
                if (local_188 != (undefined1  [8])&local_178) {
                  operator_delete((void *)local_188,local_178._M_allocated_capacity + 1);
                }
                if (local_168._M_head_impl != (SSL *)0x0) {
                  (*(local_168._M_head_impl)->method->ssl_new)(local_168._M_head_impl);
                }
                if (local_1a0 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_1a0,local_1a0);
                }
              }
              else {
                local_168._M_head_impl = (SSL *)0x0;
                local_128._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl =
                     (tuple<ssl_st_*,_bssl::internal::Deleter>)
                     (_Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>)0x0;
                bVar2 = CreateClientAndServer
                                  ((UniquePtr<SSL> *)&local_168,(UniquePtr<SSL> *)&local_128,
                                   local_190._M_head_impl,local_198._M_head_impl);
                local_1a8[0] = bVar2;
                local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                ;
                if (bVar2) {
LAB_0016e168:
                  bVar2 = InstallECHConfigList
                                    (local_168._M_head_impl,(SSL_ECH_KEYS *)local_150._0_8_);
                  local_1a8[0] = bVar2;
                  local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0;
                  if (!bVar2) {
                    testing::Message::Message((Message *)(local_160 + 8));
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_188,(internal *)local_1a8,
                               (AssertionResult *)"InstallECHConfigList(client.get(), keys1.get())",
                               "false","true",pcVar6);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)(local_150 + 8),kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x9cb,(char *)local_188);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)(local_150 + 8),(Message *)(local_160 + 8));
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_150 + 8));
                    if (local_188 != (undefined1  [8])&local_178) {
                      operator_delete((void *)local_188,local_178._M_allocated_capacity + 1);
                    }
                    if ((long *)local_160._8_8_ != (long *)0x0) {
                      (**(code **)(*(long *)local_160._8_8_ + 8))();
                    }
                    if (local_1a0 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_1a0,local_1a0);
                    }
                    if (!bVar2) goto LAB_0016e965;
                  }
                  local_188 = (undefined1  [8])0x0;
                  paStack_180 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)0x0;
                  local_178._M_allocated_capacity = 0;
                  local_1a8 = (undefined1  [8])&local_168;
                  local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_128;
                  std::vector<std::thread,std::allocator<std::thread>>::
                  emplace_back<bssl::(anonymous_namespace)::SSLTest_ECHThreads_Test::TestBody()::__0>
                            ((vector<std::thread,std::allocator<std::thread>> *)local_188,
                             (anon_class_16_2_60d54371_for__M_head_impl *)local_1a8);
                  local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_160;
                  local_1a8 = (undefined1  [8])&local_198;
                  std::vector<std::thread,std::allocator<std::thread>>::
                  emplace_back<bssl::(anonymous_namespace)::SSLTest_ECHThreads_Test::TestBody()::__1>
                            ((vector<std::thread,std::allocator<std::thread>> *)local_188,
                             (anon_class_16_2_80de2b63_for__M_head_impl *)local_1a8);
                  paVar1 = paStack_180;
                  for (auVar5 = local_188; auVar5 != (undefined1  [8])paVar1;
                      auVar5 = (undefined1  [8])((long)auVar5 + 8)) {
                    std::thread::join();
                  }
                  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                            ((vector<std::thread,_std::allocator<std::thread>_> *)local_188);
                }
                else {
                  testing::Message::Message((Message *)(local_160 + 8));
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_188,(internal *)local_1a8,
                             (AssertionResult *)
                             "CreateClientAndServer(&client, &server, client_ctx.get(), server_ctx.get())"
                             ,"false","true",pcVar6);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)(local_150 + 8),kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x9ca,(char *)local_188);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)(local_150 + 8),(Message *)(local_160 + 8));
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_150 + 8));
                  if (local_188 != (undefined1  [8])&local_178) {
                    operator_delete((void *)local_188,local_178._M_allocated_capacity + 1);
                  }
                  if ((long *)local_160._8_8_ != (long *)0x0) {
                    (**(code **)(*(long *)local_160._8_8_ + 8))();
                  }
                  if (local_1a0 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_1a0,local_1a0);
                  }
                  if (bVar2) goto LAB_0016e168;
                }
LAB_0016e965:
                std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
                          ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_128);
                std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
                          ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_168);
              }
              std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_190);
            }
            std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_198);
          }
          std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)local_160);
        }
        std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)local_150);
        std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&local_140);
      }
      EVP_HPKE_KEY_cleanup((EVP_HPKE_KEY *)local_108);
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&local_120);
      goto LAB_0016e9c8;
    }
    testing::Message::Message((Message *)local_1a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_108,(internal *)local_188,
               (AssertionResult *)
               "SSL_marshal_ech_config(&ech_config1, &ech_config1_len, 1, key1.get(), \"public.example\", 16)"
               ,"false","true",pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_120,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x9aa,(char *)local_108._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_120,(Message *)local_1a8);
    this_00 = &local_120;
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
  if ((EVP_HPKE_KEM *)local_108._0_8_ != &local_f8) {
    operator_delete((void *)local_108._0_8_,local_f8._0_8_ + 1);
  }
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_1a8 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    (**(code **)(*(long *)local_1a8 + 8))();
  }
  if (paStack_180 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&paStack_180,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paStack_180);
  }
LAB_0016e9c8:
  EVP_HPKE_KEY_cleanup(&local_98);
  return;
}

Assistant:

TEST(SSLTest, ECHThreads) {
  // Generate a pair of ECHConfigs.
  bssl::ScopedEVP_HPKE_KEY key1;
  ASSERT_TRUE(EVP_HPKE_KEY_generate(key1.get(), EVP_hpke_x25519_hkdf_sha256()));
  uint8_t *ech_config1;
  size_t ech_config1_len;
  ASSERT_TRUE(SSL_marshal_ech_config(&ech_config1, &ech_config1_len,
                                     /*config_id=*/1, key1.get(),
                                     "public.example", 16));
  bssl::UniquePtr<uint8_t> free_ech_config1(ech_config1);
  bssl::ScopedEVP_HPKE_KEY key2;
  ASSERT_TRUE(EVP_HPKE_KEY_generate(key2.get(), EVP_hpke_x25519_hkdf_sha256()));
  uint8_t *ech_config2;
  size_t ech_config2_len;
  ASSERT_TRUE(SSL_marshal_ech_config(&ech_config2, &ech_config2_len,
                                     /*config_id=*/2, key2.get(),
                                     "public.example", 16));
  bssl::UniquePtr<uint8_t> free_ech_config2(ech_config2);

  // |keys1| contains the first config. |keys12| contains both.
  bssl::UniquePtr<SSL_ECH_KEYS> keys1(SSL_ECH_KEYS_new());
  ASSERT_TRUE(keys1);
  ASSERT_TRUE(SSL_ECH_KEYS_add(keys1.get(), /*is_retry_config=*/1, ech_config1,
                               ech_config1_len, key1.get()));
  bssl::UniquePtr<SSL_ECH_KEYS> keys12(SSL_ECH_KEYS_new());
  ASSERT_TRUE(keys12);
  ASSERT_TRUE(SSL_ECH_KEYS_add(keys12.get(), /*is_retry_config=*/1, ech_config2,
                               ech_config2_len, key2.get()));
  ASSERT_TRUE(SSL_ECH_KEYS_add(keys12.get(), /*is_retry_config=*/0, ech_config1,
                               ech_config1_len, key1.get()));

  bssl::UniquePtr<SSL_CTX> server_ctx =
      CreateContextWithTestCertificate(TLS_method());
  ASSERT_TRUE(server_ctx);
  ASSERT_TRUE(SSL_CTX_set1_ech_keys(server_ctx.get(), keys1.get()));

  bssl::UniquePtr<SSL_CTX> client_ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(client_ctx);
  bssl::UniquePtr<SSL> client, server;
  ASSERT_TRUE(CreateClientAndServer(&client, &server, client_ctx.get(),
                                    server_ctx.get()));
  ASSERT_TRUE(InstallECHConfigList(client.get(), keys1.get()));

  // In parallel, complete the connection and reconfigure the ECHConfig. Note
  // |keys12| supports all the keys in |keys1|, so the handshake should complete
  // the same whichever the server uses.
  std::vector<std::thread> threads;
  threads.emplace_back([&] {
    ASSERT_TRUE(CompleteHandshakes(client.get(), server.get()));
    EXPECT_TRUE(SSL_ech_accepted(client.get()));
    EXPECT_TRUE(SSL_ech_accepted(server.get()));
  });
  threads.emplace_back([&] {
    EXPECT_TRUE(SSL_CTX_set1_ech_keys(server_ctx.get(), keys12.get()));
  });
  for (auto &thread : threads) {
    thread.join();
  }
}